

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_htmlmodelserialiser.cpp
# Opt level: O1

void __thiscall tst_HtmlModelSerialiser::validateHtmlOutput_data(tst_HtmlModelSerialiser *this)

{
  tst_SerialiserCommon *this_00;
  __atomic_base<int> _Var1;
  QTestData *pQVar2;
  QMetaTypeInterface *local_28;
  
  local_28 = &QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType;
  _Var1._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType.typeId.
               _q_value.super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var1._M_i = QMetaType::idHelper();
  }
  QTest::addColumnInternal(_Var1._M_i,"sourceModel");
  pQVar2 = (QTestData *)QTest::newRow("List Single Role");
  this_00 = &this->super_tst_SerialiserCommon;
  local_28 = (QMetaTypeInterface *)
             tst_SerialiserCommon::createStringModel(this_00,&this->super_QObject);
  operator<<(pQVar2,(QAbstractItemModel **)&local_28);
  pQVar2 = (QTestData *)QTest::newRow("Tree Multi Roles");
  local_28 = (QMetaTypeInterface *)
             tst_SerialiserCommon::createComplexModel(this_00,true,true,&this->super_QObject);
  operator<<(pQVar2,(QAbstractItemModel **)&local_28);
  pQVar2 = (QTestData *)QTest::newRow("Table Single Role");
  local_28 = (QMetaTypeInterface *)
             tst_SerialiserCommon::createComplexModel(this_00,false,false,&this->super_QObject);
  operator<<(pQVar2,(QAbstractItemModel **)&local_28);
  pQVar2 = (QTestData *)QTest::newRow("Table Multi Roles");
  local_28 = (QMetaTypeInterface *)
             tst_SerialiserCommon::createComplexModel(this_00,false,true,&this->super_QObject);
  operator<<(pQVar2,(QAbstractItemModel **)&local_28);
  pQVar2 = (QTestData *)QTest::newRow("Tree Single Role");
  local_28 = (QMetaTypeInterface *)
             tst_SerialiserCommon::createComplexModel(this_00,true,false,&this->super_QObject);
  operator<<(pQVar2,(QAbstractItemModel **)&local_28);
  pQVar2 = (QTestData *)QTest::newRow("abvbavole");
  local_28 = (QMetaTypeInterface *)
             tst_SerialiserCommon::createStringModel(this_00,&this->super_QObject);
  operator<<(pQVar2,(QAbstractItemModel **)&local_28);
  return;
}

Assistant:

void tst_HtmlModelSerialiser::validateHtmlOutput_data()
{
    QTest::addColumn<const QAbstractItemModel *>("sourceModel");
    QTest::newRow("List Single Role") << static_cast<const QAbstractItemModel *>(createStringModel(this));
#ifdef COMPLEX_MODEL_SUPPORT
    QTest::newRow("Tree Multi Roles") << static_cast<const QAbstractItemModel *>(createComplexModel(true, true, this));
    QTest::newRow("Table Single Role") << static_cast<const QAbstractItemModel *>(createComplexModel(false, false, this));
    QTest::newRow("Table Multi Roles") << static_cast<const QAbstractItemModel *>(createComplexModel(false, true, this));
    QTest::newRow("Tree Single Role") << static_cast<const QAbstractItemModel *>(createComplexModel(true, false, this));
    QTest::newRow("abvbavole") << static_cast<const QAbstractItemModel *>(createStringModel(this));
#endif
}